

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O0

void __thiscall
Clasp::DefaultUnfoundedCheck::MinimalityCheck::schedNext(MinimalityCheck *this,uint32 level,bool ok)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  byte in_DL;
  uint in_ESI;
  uint *in_RDI;
  double dVar4;
  double p;
  uint local_c [3];
  
  in_RDI[3] = 0;
  in_RDI[4] = 0xffffffff;
  if ((in_DL & 1) == 0) {
    in_RDI[2] = in_ESI;
    in_RDI[4] = 0;
  }
  else if ((*in_RDI >> 0x18 & 0x7f) != 0) {
    uVar1 = *in_RDI;
    local_c[0] = in_ESI;
    puVar3 = std::max<unsigned_int>(in_RDI + 2,local_c);
    in_RDI[2] = *puVar3;
    in_RDI[3] = local_c[0];
    if (in_RDI[2] <= in_RDI[3]) {
      in_RDI[2] = (*in_RDI & 0xffffff) + in_RDI[2];
    }
    uVar2 = in_RDI[3];
    dVar4 = ceil((double)(in_RDI[2] - uVar2) * ((double)(uVar1 >> 0x18 & 0x7f) / 100.0));
    in_RDI[4] = uVar2 + (int)(long)dVar4;
  }
  return;
}

Assistant:

void DefaultUnfoundedCheck::MinimalityCheck::schedNext(uint32 level, bool ok) {
	low  = 0;
	next = UINT32_MAX;
	if (!ok) {
		high = level;
		next = 0;
	}
	else if (fwd.highPct != 0) {
		double p = fwd.highPct / 100.0;
		high     = std::max(high, level);
		low      = level;
		if (low >= high) {
			high  += fwd.highStep;
		}
		next     = low + (uint32)std::ceil((high - low) * p);
	}
}